

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O3

LPVOID SHMPtrToPtr(SHMPTR shmptr)

{
  ulong uVar1;
  char *__format;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001d8553;
  if (shmptr == 0) {
    return (LPVOID)0x0;
  }
  uVar2 = (uint)shmptr;
  uVar1 = shmptr >> 0x18 & 0xff;
  if (shm_numsegments <= (int)uVar1) {
    fprintf(_stderr,"] %s %s:%d","SHMPtrToPtr",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x349);
    __format = "Segment %d still unknown; returning NULL\n";
    goto LAB_001d849a;
  }
  uVar4 = uVar2 & 0xffffff;
  if (0x3ffff < uVar4) {
    fprintf(_stderr,"] %s %s:%d","SHMPtrToPtr",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x354);
    fprintf(_stderr,"Offset %d is larger than segment size (%d)! returning NULL\n",(ulong)uVar4,
            0x40000);
    return (LPVOID)0x0;
  }
  if (uVar2 < 0x1000000) {
    if (0xbf < (uVar2 & 0xffffc0)) {
LAB_001d84f5:
      if (PAL_InitializeChakraCoreCalled) {
        return (LPVOID)((long)shm_segment_bases[uVar1].m_val + (ulong)(uVar2 & 0xffffff));
      }
LAB_001d8553:
      abort();
    }
    uVar3 = 0x35e;
  }
  else {
    if ((shmptr & 0xffffc0) != 0) goto LAB_001d84f5;
    uVar3 = 0x366;
  }
  fprintf(_stderr,"] %s %s:%d","SHMPtrToPtr",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
          ,uVar3);
  __format = "Offset %d is in segment header! returning NULL\n";
  uVar1 = (ulong)uVar4;
LAB_001d849a:
  fprintf(_stderr,__format,uVar1);
  return (LPVOID)0x0;
}

Assistant:

LPVOID SHMPtrToPtr(SHMPTR shmptr)
{
    void *retval;
    int segment;
    int offset;

    TRACE("Converting SHMPTR 0x%08x to a valid pointer...\n", shmptr);
    if(!shmptr)
    {
        WARN("Got SHMPTR \"0\"; returning NULL pointer\n");
        return NULL;
    }

    segment = SHMPTR_SEGMENT(shmptr);

    /* If segment isn't known, it may have been added by another process. We
       need to map all new segments into our address space. */
    if(segment>= shm_numsegments)
    {
        TRACE("SHMPTR is in segment %d, we know only %d. We must now map all "
              "unknowns.\n", segment, shm_numsegments);
        SHMMapUnknownSegments();

        /* if segment is still unknown, then it doesn't exist */
        if(segment>=shm_numsegments)
        {
            ASSERT("Segment %d still unknown; returning NULL\n", segment);
            return NULL;
        }
        TRACE("Segment %d found; continuing\n", segment);
    }

    /* Make sure the offset doesn't point outside the segment */
    offset = SHMPTR_OFFSET(shmptr);
    if(offset>=segment_size)
    {
        ASSERT("Offset %d is larger than segment size (%d)! returning NULL\n",
              offset, segment_size);
        return NULL;

    }

    /* Make sure the offset doesn't point in the segment's header */
    if(segment == 0)
    {
        if (static_cast<size_t>(offset) < roundup(sizeof(SHM_FIRST_HEADER), sizeof(INT64)))
        {
            ASSERT("Offset %d is in segment header! returning NULL\n", offset);
            return NULL;
        }
    }
    else
    {
        if (static_cast<size_t>(offset) < sizeof(SHM_SEGMENT_HEADER))
        {
            ASSERT("Offset %d is in segment header! returning NULL\n", offset);
            return NULL;
        }
    }

    retval = shm_segment_bases[segment];
    retval = static_cast<BYTE*>(retval) + offset;

    TRACE("SHMPTR %#x is at offset %d in segment %d; maps to address %p\n",
          shmptr, offset, segment, retval);
    return retval;
}